

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::Execute(ClientContext *this,shared_ptr<duckdb::Relation,_true> *relation)

{
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  Relation *pRVar5;
  undefined4 extraout_var;
  shared_ptr<duckdb::Relation,_true> *relation_00;
  pointer pPVar6;
  type lock_00;
  pointer pQVar7;
  reference pvVar8;
  const_reference pvVar9;
  LogicalType *pLVar10;
  reference pvVar11;
  string *psVar12;
  string *__lhs;
  shared_ptr<duckdb::Relation,_true> *in_RDX;
  idx_t i;
  ulong uVar13;
  pointer *__ptr;
  idx_t i_2;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_1d8;
  undefined1 local_1d0 [8];
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  string err_str;
  undefined1 local_1a0 [48];
  undefined1 local_170 [64];
  ErrorData local_130;
  ErrorData local_b0;
  vector<duckdb::ColumnDefinition,_true> *this_00;
  
  make_uniq<duckdb::ClientContextLock,std::mutex&>((duckdb *)&lock,(mutex *)(relation + 0x24));
  pRVar5 = shared_ptr<duckdb::Relation,_true>::operator->(in_RDX);
  iVar4 = (*pRVar5->_vptr_Relation[2])(pRVar5);
  this_00 = (vector<duckdb::ColumnDefinition,_true> *)CONCAT44(extraout_var,iVar4);
  relation_00 = (shared_ptr<duckdb::Relation,_true> *)
                unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                ::operator*(&lock);
  PendingQueryInternal
            ((ClientContext *)local_1d0,(ClientContextLock *)relation,relation_00,SUB81(in_RDX,0));
  pPVar6 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)local_1d0);
  if ((pPVar6->super_BaseQueryResult).success == false) {
    pPVar6 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_1d0);
    ErrorData::ErrorData(&local_b0,&(pPVar6->super_BaseQueryResult).error);
    err_str._M_dataplus._M_p = (pointer)&err_str.field_2;
    err_str._M_string_length = 0;
    err_str.field_2._M_local_buf[0] = '\0';
    ErrorResult<duckdb::MaterializedQueryResult>
              ((ClientContext *)local_1a0,(ErrorData *)relation,(string *)&local_b0);
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1a0._0_8_;
    local_1a0._0_8_ = (_Head_base<0UL,_duckdb::Logger_*,_false>)0x0;
    ::std::__cxx11::string::~string((string *)&err_str);
    ErrorData::~ErrorData(&local_b0);
  }
  else {
    local_1d8._M_head_impl = (QueryResult *)0x0;
    unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>::
    operator*(&lock);
    lock_00 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              ::operator*((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_1d0);
    PendingQueryResult::ExecuteInternal((PendingQueryResult *)&err_str,(ClientContextLock *)lock_00)
    ;
    _Var2 = err_str._M_dataplus;
    _Var1._M_head_impl = local_1d8._M_head_impl;
    err_str._M_dataplus._M_p = (pointer)0x0;
    local_1d8._M_head_impl = (QueryResult *)_Var2._M_p;
    if ((_Var1._M_head_impl != (QueryResult *)0x0) &&
       ((*((_Var1._M_head_impl)->super_BaseQueryResult)._vptr_BaseQueryResult[1])(),
       err_str._M_dataplus._M_p != (pointer)0x0)) {
      (**(code **)(*(long *)err_str._M_dataplus._M_p + 8))();
    }
    pQVar7 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
             operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                         *)&local_1d8);
    if ((pQVar7->super_BaseQueryResult).success == false) {
LAB_0146587c:
      (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1d8._M_head_impl;
    }
    else {
      pQVar7 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
               operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)&local_1d8);
      if (((long)(pQVar7->super_BaseQueryResult).types.
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(pQVar7->super_BaseQueryResult).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18 ==
          ((long)(this_00->
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this_00->
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xd8) {
        uVar13 = 0;
        do {
          pQVar7 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                   operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                               *)&local_1d8);
          if ((ulong)(((long)(pQVar7->super_BaseQueryResult).types.
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pQVar7->super_BaseQueryResult).types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar13)
          goto LAB_0146587c;
          pQVar7 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                   operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                               *)&local_1d8);
          pvVar8 = vector<duckdb::LogicalType,_true>::get<true>
                             (&(pQVar7->super_BaseQueryResult).types,uVar13);
          pvVar9 = vector<duckdb::ColumnDefinition,_true>::get<true>(this_00,uVar13);
          pLVar10 = ColumnDefinition::Type(pvVar9);
          bVar3 = LogicalType::operator!=(pvVar8,pLVar10);
          if (bVar3) break;
          pQVar7 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                   operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                               *)&local_1d8);
          pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>(&(pQVar7->super_BaseQueryResult).names,uVar13);
          pvVar9 = vector<duckdb::ColumnDefinition,_true>::get<true>(this_00,uVar13);
          psVar12 = ColumnDefinition::Name_abi_cxx11_(pvVar9);
          bVar3 = ::std::operator!=(pvVar11,psVar12);
          uVar13 = uVar13 + 1;
        } while (!bVar3);
      }
      local_1a0._32_8_ = relation;
      local_1a0._40_8_ = this;
      ::std::__cxx11::string::string
                ((string *)&err_str,"Result mismatch in query!\nExpected the following columns: [",
                 (allocator *)local_1a0);
      psVar12 = (string *)(local_170 + 0x20);
      for (uVar13 = 0;
          uVar13 < (ulong)(((long)(this_00->
                                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                  ).
                                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 ).
                                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xd8);
          uVar13 = uVar13 + 1) {
        if (uVar13 != 0) {
          ::std::__cxx11::string::append((char *)&err_str);
        }
        pvVar9 = vector<duckdb::ColumnDefinition,_true>::get<true>(this_00,uVar13);
        __lhs = ColumnDefinition::Name_abi_cxx11_(pvVar9);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_170,__lhs," ");
        pvVar9 = vector<duckdb::ColumnDefinition,_true>::get<true>(this_00,uVar13);
        pLVar10 = ColumnDefinition::Type(pvVar9);
        LogicalType::ToString_abi_cxx11_(psVar12,pLVar10);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_170,psVar12);
        ::std::__cxx11::string::append((string *)&err_str);
        ::std::__cxx11::string::~string((string *)local_1a0);
        ::std::__cxx11::string::~string((string *)psVar12);
        ::std::__cxx11::string::~string((string *)local_170);
      }
      ::std::__cxx11::string::append((char *)&err_str);
      psVar12 = (string *)(local_170 + 0x20);
      for (uVar13 = 0;
          pQVar7 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                   operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                               *)&local_1d8),
          uVar13 < (ulong)(((long)(pQVar7->super_BaseQueryResult).types.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pQVar7->super_BaseQueryResult).types.
                                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                 .
                                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar13 = uVar13 + 1) {
        ::std::__cxx11::string::append((char *)&err_str);
        pQVar7 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                 operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                             *)&local_1d8);
        pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(&(pQVar7->super_BaseQueryResult).names,uVar13);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_170,pvVar11," ");
        pQVar7 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                 operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                             *)&local_1d8);
        pvVar8 = vector<duckdb::LogicalType,_true>::get<true>
                           (&(pQVar7->super_BaseQueryResult).types,uVar13);
        LogicalType::ToString_abi_cxx11_(psVar12,pvVar8);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_170,psVar12);
        ::std::__cxx11::string::append((string *)&err_str);
        ::std::__cxx11::string::~string((string *)local_1a0);
        ::std::__cxx11::string::~string((string *)psVar12);
        ::std::__cxx11::string::~string((string *)local_170);
      }
      ::std::__cxx11::string::append((char *)&err_str);
      ErrorData::ErrorData(&local_130,&err_str);
      local_1a0._0_8_ = (long)local_1a0 + 0x10;
      local_1a0._8_8_ = (pointer)0x0;
      local_1a0[0x10] = '\0';
      ErrorResult<duckdb::MaterializedQueryResult>
                ((ClientContext *)local_170,(ErrorData *)local_1a0._32_8_,(string *)&local_130);
      this = (ClientContext *)local_1a0._40_8_;
      ((BaseQueryResult *)local_1a0._40_8_)->_vptr_BaseQueryResult = (_func_int **)local_170._0_8_;
      local_170._0_8_ = (_func_int **)0x0;
      ::std::__cxx11::string::~string((string *)local_1a0);
      ErrorData::~ErrorData(&local_130);
      ::std::__cxx11::string::~string((string *)&err_str);
      if ((element_type *)local_1d8._M_head_impl != (element_type *)0x0) {
        (**(code **)(*(long *)&(((weak_ptr<duckdb::ClientContext,_true> *)
                                &((local_1d8._M_head_impl)->super_BaseQueryResult).
                                 _vptr_BaseQueryResult)->internal).
                               super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> +
                    8))();
      }
    }
  }
  if (local_1d0 != (undefined1  [8])0x0) {
    (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                 &((BaseQueryResult *)local_1d0)->_vptr_BaseQueryResult)->internal).
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr(&lock.
               super_unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
             );
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (__uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> ClientContext::Execute(const shared_ptr<Relation> &relation) {
	auto lock = LockContext();
	auto &expected_columns = relation->Columns();
	auto pending = PendingQueryInternal(*lock, relation, false);
	if (!pending->success) {
		return ErrorResult<MaterializedQueryResult>(pending->GetErrorObject());
	}

	unique_ptr<QueryResult> result;
	result = ExecutePendingQueryInternal(*lock, *pending);
	if (result->HasError()) {
		return result;
	}
	// verify that the result types and result names of the query match the expected result types/names
	if (result->types.size() == expected_columns.size()) {
		bool mismatch = false;
		for (idx_t i = 0; i < result->types.size(); i++) {
			if (result->types[i] != expected_columns[i].Type() || result->names[i] != expected_columns[i].Name()) {
				mismatch = true;
				break;
			}
		}
		if (!mismatch) {
			// all is as expected: return the result
			return result;
		}
	}
	// result mismatch
	string err_str = "Result mismatch in query!\nExpected the following columns: [";
	for (idx_t i = 0; i < expected_columns.size(); i++) {
		if (i > 0) {
			err_str += ", ";
		}
		err_str += expected_columns[i].Name() + " " + expected_columns[i].Type().ToString();
	}
	err_str += "]\nBut result contained the following: ";
	for (idx_t i = 0; i < result->types.size(); i++) {
		err_str += i == 0 ? "[" : ", ";
		err_str += result->names[i] + " " + result->types[i].ToString();
	}
	err_str += "]";
	return ErrorResult<MaterializedQueryResult>(ErrorData(err_str));
}